

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMultiPartInputFile.cpp
# Opt level: O0

void __thiscall
Imf_2_5::MultiPartInputFile::MultiPartInputFile
          (MultiPartInputFile *this,IStream *is,int numThreads,bool reconstructChunkOffsetTable)

{
  _func_int **pp_Var1;
  _func_int *in_RSI;
  GenericInputFile *in_RDI;
  stringstream _iex_replace_s;
  MultiPartInputFile *in_stack_000000e0;
  BaseExc *e;
  undefined1 in_stack_fffffffffffffe07;
  int in_stack_fffffffffffffe08;
  undefined1 in_stack_fffffffffffffe0f;
  Data *in_stack_fffffffffffffe10;
  
  GenericInputFile::GenericInputFile(in_RDI);
  in_RDI->_vptr_GenericInputFile = (_func_int **)&PTR__MultiPartInputFile_0040da78;
  pp_Var1 = (_func_int **)operator_new(0xa8);
  Data::Data(in_stack_fffffffffffffe10,(bool)in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08,
             (bool)in_stack_fffffffffffffe07);
  in_RDI[1]._vptr_GenericInputFile = pp_Var1;
  in_RDI[1]._vptr_GenericInputFile[5] = in_RSI;
  initialize(in_stack_000000e0);
  return;
}

Assistant:

MultiPartInputFile::MultiPartInputFile (OPENEXR_IMF_INTERNAL_NAMESPACE::IStream& is,
                                        int numThreads,
                                        bool reconstructChunkOffsetTable):
    _data(new Data(false, numThreads, reconstructChunkOffsetTable))
{
    try
    {
        _data->is = &is;
        initialize();
    }
    catch (IEX_NAMESPACE::BaseExc &e)
    {
        delete _data;

        REPLACE_EXC (e, "Cannot read image file "
                     "\"" << is.fileName() << "\". " << e.what());
        throw;
    }
    catch (...)
    {
        delete _data;
        throw;
    }
}